

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool ON_IsDuplicateKnotVector
               (int order,int cv_count,double *knot,double *other_knot,bool bIgnoreParameterization)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  ON_Interval other_dom;
  ON_Interval dom;
  ON_Interval local_50;
  ON_Interval local_40;
  
  bVar1 = false;
  if ((((order <= cv_count) && (1 < order)) && (bVar1 = false, knot != (double *)0x0)) &&
     (other_knot != (double *)0x0)) {
    iVar2 = ON_KnotCount(order,cv_count);
    if (bIgnoreParameterization) {
      ON_Interval::ON_Interval(&local_40,knot[order - 2U],knot[(long)cv_count + -1]);
      ON_Interval::ON_Interval(&local_50,other_knot[order - 2U],other_knot[(long)cv_count + -1]);
      bVar1 = true;
      lVar3 = 0;
      while ((lVar3 < iVar2 && (bVar1))) {
        dVar4 = ON_Interval::NormalizedParameterAt(&local_40,knot[lVar3]);
        dVar5 = ON_Interval::NormalizedParameterAt(&local_40,other_knot[lVar3]);
        bVar1 = ABS(dVar4 - dVar5) <= 2.3283064365386963e-10;
        lVar3 = lVar3 + 1;
      }
    }
    else {
      bVar1 = true;
      lVar3 = 0;
      while ((lVar3 < iVar2 && (bVar1))) {
        bVar1 = other_knot[lVar3] == knot[lVar3];
        lVar3 = lVar3 + 1;
      }
    }
  }
  return bVar1;
}

Assistant:

static bool ON_IsDuplicateKnotVector( int order, int cv_count, 
               const double* knot, const double* other_knot,
               bool bIgnoreParameterization )
{
  bool rc = (    0 != knot 
              && 0 != other_knot 
              && order >= 2 
              && cv_count >= order);

  if (rc)
  {
    const int knot_count = ON_KnotCount( order, cv_count );
    int i;
    if ( bIgnoreParameterization )
    {
      const ON_Interval dom(knot[order-2],knot[cv_count-1]);
      const ON_Interval other_dom(other_knot[order-2],other_knot[cv_count-1]);
      double k, other_k;
      for ( i = 0; i < knot_count && rc; i++ )
      {
        k = dom.NormalizedParameterAt(knot[i]);
        other_k = dom.NormalizedParameterAt(other_knot[i]);
        rc = (fabs(k-other_k) <= ON_ZERO_TOLERANCE);
      }
    }
    else
    {
      for ( i = 0; i < knot_count && rc; i++ )
      {
        rc = (knot[i] == other_knot[i]);
      }
    }
  }
  return rc;
}